

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_aam_x86_64(CPUX86State *env,int base)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = env->regs[0] & 0xff;
  uVar2 = (long)uVar1 % (long)base & 0xffffffff;
  env->regs[0] = env->regs[0] & 0xffffffffffff0000 | uVar2 |
                 (long)((int)((long)uVar1 / (long)base) << 8);
  env->cc_dst = uVar2;
  return;
}

Assistant:

void helper_aam(CPUX86State *env, int base)
{
    int al, ah;

    al = env->regs[R_EAX] & 0xff;
    ah = al / base;
    al = al % base;
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xffff) | al | (ah << 8);
    CC_DST = al;
}